

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

ULONG __thiscall Js::FunctionBody::GetSourceLineNumber(FunctionBody *this,uint statementIndex)

{
  uint startCharOfStatement;
  ULONG local_18;
  uint startOffset;
  ULONG line;
  uint statementIndex_local;
  FunctionBody *this_local;
  
  local_18 = 0;
  if ((statementIndex != 0xffffffff) &&
     ((startOffset = statementIndex, _line = this,
      startCharOfStatement = GetStartOffset(this,statementIndex), startCharOfStatement != 0 ||
      (startOffset == 0)))) {
    GetLineCharOffsetFromStartChar(this,startCharOfStatement,&local_18,(LONG *)0x0,false);
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

ULONG FunctionBody::GetSourceLineNumber(uint statementIndex)
    {
        ULONG line = 0;
        if (statementIndex != Js::Constants::NoStatementIndex)
        {
            uint startOffset = GetStartOffset(statementIndex);

            if (startOffset != 0 || statementIndex == 0)
            {
                GetLineCharOffsetFromStartChar(startOffset, &line, nullptr, false /*canAllocateLineCache*/);
                line = line + 1;
            }
        }

        return line;
    }